

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::setViewMode(QMdiAreaPrivate *this,ViewMode mode)

{
  bool bVar1;
  QMdiArea *pQVar2;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar3;
  ViewMode in_ESI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *current_1;
  QMdiSubWindow *subWindow;
  QList<QPointer<QMdiSubWindow>_> *__range2;
  QMdiArea *q;
  QMdiSubWindow *current;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  QWidget *in_stack_ffffffffffffff28;
  AreaOption option;
  QMdiAreaTabBar *in_stack_ffffffffffffff30;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *this_02;
  QWidget *in_stack_ffffffffffffff38;
  QAbstractScrollArea *in_stack_ffffffffffffff40;
  QMdiArea *in_stack_ffffffffffffff48;
  Connection local_78;
  QObject local_70 [7];
  undefined1 in_stack_ffffffffffffff97;
  Connection in_stack_ffffffffffffff98;
  QMdiAreaPrivate *in_stack_ffffffffffffffa8;
  QIcon local_40;
  QPointer<QMdiSubWindow> *local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  if ((in_RDI->viewMode != in_ESI) && ((in_RDI->inViewModeChange & 1U) == 0)) {
    in_RDI->inViewModeChange = true;
    if (in_ESI == TabbedView) {
      this_00 = (QWidget *)operator_new(0x28);
      QMdiAreaTabBar::QMdiAreaTabBar(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_RDI->tabBar = (QMdiAreaTabBar *)this_00;
      QTabBar::setDocumentMode
                (&in_stack_ffffffffffffff30->super_QTabBar,
                 SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      QTabBar::setTabsClosable
                ((QTabBar *)in_stack_ffffffffffffff98.d_ptr,(bool)in_stack_ffffffffffffff97);
      QTabBar::setMovable(&in_stack_ffffffffffffff30->super_QTabBar,
                          SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      pQVar3 = (QWidget *)in_RDI->tabBar;
      _q_tb_tabBarShapeFrom(in_RDI->tabShape,in_RDI->tabPosition);
      QTabBar::setShape(&in_stack_ffffffffffffff30->super_QTabBar,
                        (Shape)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      in_RDI->isSubWindowsTiled = false;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QPointer<QMdiSubWindow>_>::QList
                ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff30,
                 (QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff28);
      local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QPointer<QMdiSubWindow>_>::begin
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff30);
      local_30.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = QList<QPointer<QMdiSubWindow>_>::end
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff30);
      while( true ) {
        local_38 = local_30.i;
        bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,local_30);
        if (!bVar1) break;
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
        ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x61292f);
        in_stack_ffffffffffffff38 = (QWidget *)in_RDI->tabBar;
        QWidget::windowIcon(pQVar3);
        tabTextFor((QMdiSubWindow *)in_RDI);
        QTabBar::addTab(&in_stack_ffffffffffffff30->super_QTabBar,(QIcon *)in_stack_ffffffffffffff28
                        ,(QString *)0x612986);
        QString::~QString((QString *)0x612993);
        QIcon::~QIcon(&local_40);
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
      }
      this_01 = &QMdiArea::currentSubWindow((QMdiArea *)pQVar3)->super_QWidget;
      if (this_01 == (QWidget *)0x0) {
        in_RDI->viewMode = TabbedView;
      }
      else {
        this_02 = (QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)in_RDI->tabBar;
        QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                  (this_02,(QMdiSubWindow **)in_stack_ffffffffffffff28,0x6129ef);
        option = (AreaOption)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        QTabBar::setCurrentIndex((QTabBar *)pQVar3,(int)((ulong)this_00 >> 0x20));
        bVar1 = QWidget::isMaximized(this_01);
        if (bVar1) {
          QWidget::showNormal(in_stack_ffffffffffffff38);
        }
        in_RDI->viewMode = TabbedView;
        bVar1 = QMdiArea::testOption((QMdiArea *)this_02,option);
        if (!bVar1) {
          QWidget::showMaximized(in_stack_ffffffffffffff38);
        }
      }
      bVar1 = QWidget::isVisible((QWidget *)0x612a5c);
      if (bVar1) {
        QWidget::show(this_00);
      }
      updateTabBarGeometry(in_stack_ffffffffffffffa8);
      QObject::connect((QObject *)&stack0xffffffffffffff98,(char *)in_RDI->tabBar,
                       (QObject *)"2currentChanged(int)",(char *)pQVar2,0xb1ef80);
      QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffff98);
      QObject::connect(local_70,(char *)in_RDI->tabBar,(QObject *)"2tabCloseRequested(int)",
                       (char *)pQVar2,0xb1efb3);
      QMetaObject::Connection::~Connection((Connection *)local_70);
      QObject::connect((QObject *)&local_78,(char *)in_RDI->tabBar,(QObject *)"2tabMoved(int,int)",
                       (char *)pQVar2,0xb1efd8);
      QMetaObject::Connection::~Connection(&local_78);
      QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x612b2c);
    }
    else {
      if (in_RDI->tabBar != (QMdiAreaTabBar *)0x0) {
        (**(code **)(*(long *)&(in_RDI->tabBar->super_QTabBar).super_QWidget + 0x20))();
      }
      in_RDI->tabBar = (QMdiAreaTabBar *)0x0;
      in_RDI->viewMode = in_ESI;
      QAbstractScrollArea::setViewportMargins
                (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (int)in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (int)in_stack_ffffffffffffff30);
      in_RDI->indexToLastActiveTab = -1;
      pQVar3 = &QMdiArea::currentSubWindow(in_stack_ffffffffffffff48)->super_QWidget;
      if ((pQVar3 != (QWidget *)0x0) && (bVar1 = QWidget::isMaximized(pQVar3), bVar1)) {
        QWidget::showNormal(in_stack_ffffffffffffff38);
      }
    }
    in_RDI->inViewModeChange = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::setViewMode(QMdiArea::ViewMode mode)
{
    Q_Q(QMdiArea);
    if (viewMode == mode || inViewModeChange)
        return;

    // Just a guard since we cannot set viewMode = mode here.
    inViewModeChange = true;

#if QT_CONFIG(tabbar)
    if (mode == QMdiArea::TabbedView) {
        Q_ASSERT(!tabBar);
        tabBar = new QMdiAreaTabBar(q);
        tabBar->setDocumentMode(documentMode);
        tabBar->setTabsClosable(tabsClosable);
        tabBar->setMovable(tabsMovable);
#if QT_CONFIG(tabwidget)
        tabBar->setShape(_q_tb_tabBarShapeFrom(tabShape, tabPosition));
#endif

        isSubWindowsTiled = false;

        // Take a copy as tabBar->addTab() will (indirectly) create a connection between
        // the tab close button clicked() signal and the _q_closeTab() slot, which may
        // indirectly call QCoreApplication::sendEvent(), the latter could result in
        // invoking unknown code that could e.g. recurse into the class modifying childWindows.
        const auto subWindows = childWindows;
        for (QMdiSubWindow *subWindow : subWindows)
            tabBar->addTab(subWindow->windowIcon(), tabTextFor(subWindow));

        QMdiSubWindow *current = q->currentSubWindow();
        if (current) {
            tabBar->setCurrentIndex(childWindows.indexOf(current));
            // Restore sub-window (i.e. cleanup buttons in menu bar and window title).
            if (current->isMaximized())
                current->showNormal();

            viewMode = mode;

            // Now, maximize it.
            if (!q->testOption(QMdiArea::DontMaximizeSubWindowOnActivation)) {
                current->showMaximized();
            }
        } else {
            viewMode = mode;
        }

        if (q->isVisible())
            tabBar->show();
        updateTabBarGeometry();

        QObject::connect(tabBar, SIGNAL(currentChanged(int)), q, SLOT(_q_currentTabChanged(int)));
        QObject::connect(tabBar, SIGNAL(tabCloseRequested(int)), q, SLOT(_q_closeTab(int)));
        QObject::connect(tabBar, SIGNAL(tabMoved(int,int)), q, SLOT(_q_moveTab(int,int)));
    } else
#endif // QT_CONFIG(tabbar)
    { // SubWindowView
#if QT_CONFIG(tabbar)
        delete tabBar;
        tabBar = nullptr;
#endif // QT_CONFIG(tabbar)

        viewMode = mode;
        q->setViewportMargins(0, 0, 0, 0);
        indexToLastActiveTab = -1;

        QMdiSubWindow *current = q->currentSubWindow();
        if (current && current->isMaximized())
            current->showNormal();
    }

    Q_ASSERT(viewMode == mode);
    inViewModeChange = false;
}